

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

void __thiscall
GameEngine::populationSplit
          (GameEngine *this,shared_ptr<Population> *population,int32_t destination_x,
          int32_t destination_y)

{
  Population *this_00;
  CellType *this_01;
  Player *this_02;
  int32_t iVar1;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar2;
  shared_ptr<Population> new_population;
  __shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = (population->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar1 = Population::GetAnimalAmount(this_00);
  Population::SetAnimalAmount(this_00,iVar1 / 2);
  std::make_shared<Population,Population&>((Population *)&new_population);
  pvVar2 = Map::operator[]((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           (long)destination_y);
  this_01 = (pvVar2->
            super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
            )._M_impl.super__Vector_impl_data._M_start[destination_x].
            super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&new_population.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>);
  CellType::setCurrentPopulation(this_01,(shared_ptr<Population> *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  Population::SetXPos(new_population.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,destination_x);
  Population::SetYPos(new_population.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,destination_y);
  this_02 = (this->players).
            super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
            _M_impl.super__Vector_impl_data._M_start[this->currentPlayer].
            super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&new_population.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>);
  Player::addNewPopulation(this_02,(shared_ptr<Population> *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&new_population.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

void GameEngine::populationSplit(std::shared_ptr<Population> population, int32_t destination_x, int32_t destination_y) {
  population->SetAnimalAmount(population->GetAnimalAmount() / 2);
  std::shared_ptr<Population> new_population = std::make_shared<Population>(*(population));

  (*map)[destination_y][destination_x]->setCurrentPopulation(new_population);

  new_population->SetXPos(destination_x);
  new_population->SetYPos(destination_y);
  players[currentPlayer]->addNewPopulation(new_population);
}